

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

void __thiscall cmAlphaNum::cmAlphaNum(cmAlphaNum *this,int val)

{
  int val_local;
  cmAlphaNum *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->View_);
  (anonymous_namespace)::MakeDigits<32ul,int>(&this->View_,&this->Digits_,"%i",val);
  return;
}

Assistant:

cmAlphaNum::cmAlphaNum(int val)
{
  MakeDigits(this->View_, this->Digits_, "%i", val);
}